

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarIntG8IU.h
# Opt level: O0

void __thiscall FastPForLib::VarIntG8IU::VarIntG8IU(VarIntG8IU *this)

{
  undefined1 auVar1 [16];
  char cVar2;
  IntegerCODEC *in_RDI;
  int desc_1;
  int n;
  int i;
  int k;
  int j;
  int lastpos;
  int ithSize [8];
  int complete;
  int bitindex;
  int bitmask;
  int desc;
  char mask [256] [32];
  _func_int **local_2098;
  _func_int **pp_Stack_2090;
  _func_int **local_2088;
  _func_int **pp_Stack_2080;
  int local_2060;
  int local_205c;
  int local_2058;
  int local_2054;
  int local_204c;
  int aiStack_2048 [8];
  int local_2028;
  int local_2024;
  uint local_2020;
  uint local_201c;
  char local_2018 [16];
  undefined1 auStack_2008 [8200];
  
  IntegerCODEC::IntegerCODEC(in_RDI);
  in_RDI->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_0046fa00;
  for (local_201c = 0; (int)local_201c < 0x100; local_201c = local_201c + 1) {
    local_2020 = 1;
    local_2028 = 0;
    local_204c = -1;
    for (local_2024 = 0; local_2024 < 8; local_2024 = local_2024 + 1) {
      if ((local_201c & local_2020) == 0) {
        aiStack_2048[local_2028] = local_2024 - local_204c;
        local_204c = local_2024;
        local_2028 = local_2028 + 1;
      }
      local_2020 = local_2020 << 1;
    }
    *(int *)((long)&in_RDI[1]._vptr_IntegerCODEC + (long)(int)local_201c * 4) = local_2028;
    cVar2 = '\0';
    local_2054 = 0;
    for (local_2058 = 0; local_2058 < local_2028; local_2058 = local_2058 + 1) {
      for (local_205c = 0; local_205c < 4; local_205c = local_205c + 1) {
        if (local_205c < aiStack_2048[local_2058]) {
          local_2018[(long)local_2054 + (long)(int)local_201c * 0x20] = cVar2;
          cVar2 = cVar2 + '\x01';
        }
        else {
          local_2018[(long)local_2054 + (long)(int)local_201c * 0x20] = -1;
        }
        local_2054 = local_2054 + 1;
      }
    }
  }
  for (local_2060 = 0; local_2060 < 0x100; local_2060 = local_2060 + 1) {
    auVar1 = vlddqu_avx(*(undefined1 (*) [16])(local_2018 + (long)local_2060 * 0x20));
    local_2088 = auVar1._0_8_;
    pp_Stack_2080 = auVar1._8_8_;
    in_RDI[(long)local_2060 * 4 + 0x82]._vptr_IntegerCODEC = local_2088;
    (in_RDI + (long)local_2060 * 4 + 0x82)[1]._vptr_IntegerCODEC = pp_Stack_2080;
    auVar1 = vlddqu_avx(*(undefined1 (*) [16])(auStack_2008 + (long)local_2060 * 0x20));
    local_2098 = auVar1._0_8_;
    pp_Stack_2090 = auVar1._8_8_;
    in_RDI[(long)local_2060 * 4 + 0x84]._vptr_IntegerCODEC = local_2098;
    in_RDI[(long)local_2060 * 4 + 0x85]._vptr_IntegerCODEC = pp_Stack_2090;
  }
  return;
}

Assistant:

VarIntG8IU() {
    char mask[256][32];
    for (int desc = 0; desc <= 255; desc++) {
      int bitmask = 0x00000001;
      int bitindex = 0;
      // count number of 0 in the char
      int complete = 0;
      int ithSize[8];
      int lastpos = -1;
      while (bitindex < 8) {
        if ((desc & bitmask) == 0) {
          ithSize[complete] = bitindex - lastpos;
          lastpos = bitindex;
          complete++;
        }
        bitindex++;
        bitmask = bitmask << 1;
      }
      maskOutputSize[desc] = complete;

      int j = 0;
      int k = 0;
      for (int i = 0; i < complete; i++) {
        for (int n = 0; n < 4; n++) {
          if (n < ithSize[i]) {
            mask[desc][k] = static_cast<unsigned char>(j);
            j = j + 1;
          } else {
            mask[desc][k] = -1;
          }
          k = k + 1;
        }
      }
    }
    for (int desc = 0; desc <= 255; desc++) {
      vecmask[desc][0] =
          _mm_lddqu_si128(reinterpret_cast<__m128i const *>(mask[desc]));
      vecmask[desc][1] =
          _mm_lddqu_si128(reinterpret_cast<__m128i const *>(mask[desc] + 16));
    }
  }